

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O2

void __thiscall
enact::OptionalTypename::OptionalTypename(OptionalTypename *this,OptionalTypename *typename_)

{
  Typename *local_20;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_18;
  
  (*((typename_->m_wrappedTypename)._M_t.
     super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
     super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
     super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[2])
            (&local_20);
  local_18._M_head_impl = local_20;
  local_20 = (Typename *)0x0;
  OptionalTypename(this,(unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                         *)&local_18);
  if (local_18._M_head_impl != (Typename *)0x0) {
    (*(local_18._M_head_impl)->_vptr_Typename[1])();
  }
  if (local_20 != (Typename *)0x0) {
    (*local_20->_vptr_Typename[1])();
  }
  return;
}

Assistant:

OptionalTypename::OptionalTypename(const OptionalTypename &typename_) :
            OptionalTypename{typename_.m_wrappedTypename->clone()} {
    }